

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::lts_20250127::CondVar::Signal(CondVar *this)

{
  ulong uVar1;
  int c;
  PerThreadSynch *pPVar2;
  PerThreadSynch *w;
  ulong uVar3;
  
  c = 0;
  do {
    uVar3 = *(ulong *)this;
    if (uVar3 == 0) {
      return;
    }
    if ((uVar3 & 1) == 0) {
      LOCK();
      uVar1 = *(ulong *)this;
      if (uVar3 == uVar1) {
        *(ulong *)this = uVar3 | 1;
      }
      UNLOCK();
      if (uVar3 == uVar1) {
        pPVar2 = (PerThreadSynch *)(uVar3 & 0xfffffffffffffffc);
        if (pPVar2 == (PerThreadSynch *)0x0) {
          pPVar2 = (PerThreadSynch *)0x0;
          w = (PerThreadSynch *)0x0;
        }
        else {
          w = pPVar2->next;
          if (w == pPVar2) {
            pPVar2 = (PerThreadSynch *)0x0;
          }
          else {
            pPVar2->next = w->next;
          }
        }
        uVar3 = (ulong)((uint)uVar3 & 2);
        *(ulong *)this = (ulong)pPVar2 | uVar3;
        if (w != (PerThreadSynch *)0x0) {
          Mutex::Fer(w->waitp->cvmu,w);
          (*(code *)lts_20250127::(anonymous_namespace)::cond_var_tracer)("Signal wakeup",this);
        }
        if (uVar3 == 0) {
          return;
        }
        PostSynchEvent(this,0xc);
        return;
      }
    }
    c = synchronization_internal::MutexDelay(c,1);
  } while( true );
}

Assistant:

void CondVar::Signal() {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  ABSL_TSAN_MUTEX_PRE_SIGNAL(nullptr, 0);
  intptr_t v;
  int c = 0;
  for (v = cv_.load(std::memory_order_relaxed); v != 0;
       v = cv_.load(std::memory_order_relaxed)) {
    if ((v & kCvSpin) == 0 &&  // attempt to acquire spinlock
        cv_.compare_exchange_strong(v, v | kCvSpin, std::memory_order_acquire,
                                    std::memory_order_relaxed)) {
      PerThreadSynch* h = reinterpret_cast<PerThreadSynch*>(v & ~kCvLow);
      PerThreadSynch* w = nullptr;
      if (h != nullptr) {  // remove first waiter
        w = h->next;
        if (w == h) {
          h = nullptr;
        } else {
          h->next = w->next;
        }
      }
      // release spinlock
      cv_.store((v & kCvEvent) | reinterpret_cast<intptr_t>(h),
                std::memory_order_release);
      if (w != nullptr) {
        w->waitp->cvmu->Fer(w);  // wake waiter, if there was one
        cond_var_tracer("Signal wakeup", this);
      }
      if ((v & kCvEvent) != 0) {
        PostSynchEvent(this, SYNCH_EV_SIGNAL);
      }
      ABSL_TSAN_MUTEX_POST_SIGNAL(nullptr, 0);
      return;
    } else {
      c = synchronization_internal::MutexDelay(c, GENTLE);
    }
  }
  ABSL_TSAN_MUTEX_POST_SIGNAL(nullptr, 0);
}